

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

Instr * __thiscall
Inline::InlineGetterSetterFunction
          (Inline *this,Instr *accessorInstr,FunctionJITTimeInfo *inlineeData,
          StackSym *symCallerThis,uint inlineCacheIndex,bool isGetter,bool *pIsInlined,
          uint recursiveInlineDepth)

{
  ScriptContext *scriptContext;
  JITTimeWorkItem *this_00;
  Func *pFVar1;
  ScriptContextProfiler *codeGenProfiler;
  void *codeGenAllocators;
  Opnd *pOVar2;
  code *pcVar3;
  char16_t *pcVar4;
  Instr *pIVar5;
  Instr *pIVar6;
  bool bVar7;
  OpndKind OVar8;
  ExecutionMode EVar9;
  bool bVar10;
  RegSlot RVar11;
  uint32 postCallByteCodeOffset;
  undefined4 *puVar12;
  RegOpnd *this_01;
  undefined4 extraout_var;
  CodeGenWorkItemIDL *workItemData;
  CodeGenWorkItemIDL *pCVar13;
  intptr_t funcBodyAddr;
  Func *this_02;
  FunctionJITTimeInfo *pFVar14;
  char16 *pcVar15;
  char16 *pcVar16;
  char16 *pcVar17;
  char16 *pcVar18;
  PropertyRecord *pPVar19;
  PropertySymOpnd *methodOpnd;
  _func_int **pp_Var20;
  ThreadContext *this_03;
  Inline *pIVar21;
  undefined7 in_register_00000089;
  wchar local_178 [4];
  char16 debugStringBuffer2 [42];
  bool local_118 [8];
  bool safeThis;
  JITTimePolymorphicInlineCacheInfo *local_c0;
  JITTimeWorkItem *local_b8;
  ThreadContextInfo *local_b0;
  ScriptContextInfo *local_a8;
  JitArenaAllocator *local_a0;
  JITOutputIDL *local_98;
  Instr *local_90;
  StackSym *local_88;
  Inline *local_80;
  Func *local_78;
  JITTimeFunctionBody *local_70;
  JITTimeFunctionBody *local_68;
  FunctionJITTimeInfo *local_60;
  undefined8 local_58;
  RegOpnd *local_50;
  Instr *local_48;
  Instr *local_40;
  FunctionJITRuntimeInfo *local_38;
  
  local_40 = (Instr *)CONCAT44(local_40._4_4_,(int)CONCAT71(in_register_00000089,isGetter));
  local_38 = (FunctionJITRuntimeInfo *)CONCAT44(local_38._4_4_,inlineCacheIndex);
  if (this->topFunc->m_isBackgroundJIT == false) {
    scriptContext = (ScriptContext *)this->topFunc->m_scriptContextInfo;
    ThreadContext::ProbeStackNoDispose(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  }
  *pIsInlined = true;
  local_90 = accessorInstr->m_next;
  local_70 = JITTimeWorkItem::GetJITFunctionBody(accessorInstr->m_func->m_workItem);
  local_68 = FunctionJITTimeInfo::GetBody(inlineeData);
  if (accessorInstr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xf90,"(!accessorInstr->GetSrc2())","!accessorInstr->GetSrc2()");
    if (!bVar7) goto LAB_0053fbaf;
    *puVar12 = 0;
  }
  local_88 = symCallerThis;
  local_48 = accessorInstr;
  if (((char)local_40 == '\0') || (accessorInstr->m_dst == (Opnd *)0x0)) {
    local_58 = 0xffffffff;
    local_50 = (RegOpnd *)0x0;
  }
  else {
    this_01 = (RegOpnd *)IR::Instr::UnlinkDst(accessorInstr);
    OVar8 = IR::Opnd::GetKind((Opnd *)this_01);
    if (OVar8 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_0053fbaf;
      *puVar12 = 0;
    }
    local_50 = this_01;
    RVar11 = StackSym::GetByteCodeRegSlot(this_01->m_sym);
    local_58 = CONCAT44(extraout_var,RVar11);
  }
  workItemData = (CodeGenWorkItemIDL *)
                 new<Memory::JitArenaAllocator>(0x60,this->topFunc->m_alloc,0x3eba5c);
  bVar7 = Func::IsJitInDebugMode(this->topFunc);
  workItemData->isJitInDebugMode = bVar7;
  workItemData->type = '\0';
  EVar9 = JITTimeWorkItem::GetJitMode(this->topFunc->m_workItem);
  workItemData->jitMode = EVar9;
  pCVar13 = JITTimeWorkItem::GetWorkItemData(this->topFunc->m_workItem);
  workItemData->nativeDataAddr = pCVar13->nativeDataAddr;
  workItemData->loopNumber = 0xffffffff;
  workItemData->jitData = &inlineeData->m_data;
  local_60 = inlineeData;
  local_b8 = (JITTimeWorkItem *)
             new<Memory::JitArenaAllocator>(0x1e0,this->topFunc->m_alloc,0x3eba5c);
  JITTimeWorkItem::JITTimeWorkItem(local_b8,workItemData);
  this_00 = this->topFunc->m_workItem;
  funcBodyAddr = JITTimeFunctionBody::GetAddr(local_68);
  local_c0 = JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(this_00,funcBodyAddr);
  this_02 = (Func *)new<Memory::JitArenaAllocator>(0x420,this->topFunc->m_alloc,0x3eba5c);
  pFVar1 = this->topFunc;
  local_a0 = pFVar1->m_alloc;
  local_b0 = pFVar1->m_threadContextInfo;
  local_a8 = pFVar1->m_scriptContextInfo;
  local_98 = JITOutput::GetOutputData(&pFVar1->m_output);
  pIVar6 = local_48;
  pFVar14 = JITTimeWorkItem::GetJITTimeInfo(local_48->m_func->m_workItem);
  local_38 = FunctionJITTimeInfo::GetLdFldInlineeRuntimeData(pFVar14,(InlineCacheIndex)local_38);
  pFVar1 = this->topFunc;
  codeGenProfiler = pFVar1->m_codeGenProfiler;
  codeGenAllocators = pFVar1->topFunc->m_codeGenAllocators;
  bVar7 = pFVar1->m_isBackgroundJIT;
  pFVar1 = pIVar6->m_func;
  local_80 = this;
  postCallByteCodeOffset = IR::Instr::GetByteCodeOffset(pIVar6->m_next);
  local_78 = this_02;
  Func::Func(this_02,local_a0,local_b8,local_b0,local_a8,local_98,(EntryPointInfo *)0x0,local_38,
             local_c0,codeGenAllocators,codeGenProfiler,bVar7,pFVar1,postCallByteCodeOffset,
             (RegSlot)local_58,false,0xffff,true);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlinePhase);
  if (((bVar7) ||
      (bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,InlineAccessorsPhase), bVar7)) ||
     (bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,InlineAccessorsPhase), bVar7)) {
    if ((char)local_40 == '\0') {
      pOVar2 = local_48->m_dst;
      OVar8 = IR::Opnd::GetKind(pOVar2);
      pFVar14 = local_60;
      if (OVar8 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar7) goto LAB_0053fbaf;
        *puVar12 = 0;
      }
      pp_Var20 = pOVar2[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var20 + 0x14) != '\x02') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar7) goto LAB_0053fbaf;
        pcVar4 = L"es5Setter";
        goto LAB_0053f989;
      }
      local_38 = (FunctionJITRuntimeInfo *)0x10e61fa;
    }
    else {
      pOVar2 = local_48->m_src1;
      OVar8 = IR::Opnd::GetKind(pOVar2);
      pFVar14 = local_60;
      if (OVar8 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar7) goto LAB_0053fbaf;
        *puVar12 = 0;
      }
      pp_Var20 = pOVar2[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var20 + 0x14) == '\x02') {
        local_38 = (FunctionJITRuntimeInfo *)0x10e61e6;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar7) goto LAB_0053fbaf;
        pcVar4 = L"es5Getter";
LAB_0053f989:
        local_38 = (FunctionJITRuntimeInfo *)(pcVar4 + 3);
        *puVar12 = 0;
      }
    }
    pcVar15 = JITTimeFunctionBody::GetDisplayName(local_68);
    pcVar16 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar14,(wchar (*) [42])local_118);
    pcVar17 = JITTimeFunctionBody::GetDisplayName(local_70);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(local_48->m_func->m_workItem);
    pcVar18 = FunctionJITTimeInfo::GetDebugNumberSet(pFVar14,(wchar (*) [42])local_178);
    this_03 = (ThreadContext *)(*(long *)(pp_Var20[8] + 0x10) + -0x40);
    if (*(long *)(pp_Var20[8] + 0x10) == 0) {
      this_03 = (ThreadContext *)0x0;
    }
    pPVar19 = ThreadContext::GetPropertyRecord(this_03,*(PropertyId *)(pp_Var20 + 3));
    Output::Print(L"INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldName: %s\n",local_38,
                  pcVar15,pcVar16,pcVar17,pcVar18,pPVar19 + 1);
    Output::Flush();
  }
  pIVar6 = local_48;
  bVar7 = (bool)(char)local_40;
  pIVar21 = (Inline *)(&local_48->m_dst)[(ulong)local_40 & 0xff];
  OVar8 = IR::Opnd::GetKind((Opnd *)pIVar21);
  if (OVar8 == OpndKindSym) {
    OVar8 = IR::Opnd::GetKind((Opnd *)pIVar21);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                          ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar10) goto LAB_0053fbaf;
      *puVar12 = 0;
    }
    bVar10 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)pIVar21);
    if (bVar10) goto LAB_0053fb0b;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar12 = 1;
  bVar10 = Js::Throw::ReportAssert
                     ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                      ,0xff7,
                      "(methodOpnd->IsSymOpnd() && methodOpnd->AsSymOpnd()->IsPropertySymOpnd())",
                      "methodOpnd->IsSymOpnd() && methodOpnd->AsSymOpnd()->IsPropertySymOpnd()");
  if (!bVar10) {
LAB_0053fbaf:
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar12 = 0;
LAB_0053fb0b:
  methodOpnd = IR::Opnd::AsPropertySymOpnd((Opnd *)pIVar21);
  local_40 = SimulateCallForGetterSetter(pIVar21,pIVar6,pIVar6,methodOpnd,bVar7);
  pFVar14 = local_60;
  pIVar21 = local_80;
  local_118[0] = false;
  TryOptimizeCallInstrWithFixedMethod
            (local_80,pIVar6,local_60,false,false,false,true,local_118,false,0);
  pIVar5 = local_90;
  InlineFunctionCommon
            (pIVar21,pIVar6,false,(StackSym *)0x0,pFVar14,local_78,local_90,local_50,local_40,
             local_88,recursiveInlineDepth,local_118[0],false);
  return pIVar5;
}

Assistant:

IR::Instr *
Inline::InlineGetterSetterFunction(IR::Instr *accessorInstr, const FunctionJITTimeInfo *const inlineeData, const StackSym *symCallerThis, const uint inlineCacheIndex, bool isGetter, bool *pIsInlined, uint recursiveInlineDepth)
{
    // This function is recursive, so when jitting in the foreground, probe the stack
    if (!this->topFunc->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(this->topFunc->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    *pIsInlined = true;
    IR::Instr *instrNext = accessorInstr->m_next;

    const JITTimeFunctionBody *funcCaller = accessorInstr->m_func->GetJITFunctionBody();
    JITTimeFunctionBody *funcBody = inlineeData->GetBody();

    Assert(!accessorInstr->GetSrc2());

    JS_ETW(EventWriteJSCRIPT_BACKEND_INLINE(
        funcCaller->GetFunctionNumber(), funcBody->GetFunctionNumber(),
        funcCaller->GetDisplayName(), funcBody->GetDisplayName()));

    IR::Instr *inlineBailoutChecksBeforeInstr = accessorInstr;


    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (isGetter && accessorInstr->GetDst())
    {
        returnValueOpnd = accessorInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    // inlinee
    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);

    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(funcBody->GetAddr());
#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetLdFldInlineeRuntimeData(inlineCacheIndex),
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetNumberAllocator(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        accessorInstr->m_func,
        accessorInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        UINT16_MAX,
        true);
#else
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetLdFldInlineeRuntimeData(inlineCacheIndex),
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        accessorInstr->m_func,
        accessorInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        UINT16_MAX,
        true);
#endif

    // funcBody->GetInParamsCount() can be greater than one even if it is all undefined. Example defineProperty(a,"foo", {get:function(a,b,c){}});

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::InlinePhase) ||
        Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::InlineAccessorsPhase) || Js::Configuration::Global.flags.Trace.IsEnabled(Js::InlineAccessorsPhase))
    {
        char16 debugStringBuffer [MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        PropertySym *propertySym = isGetter ? accessorInstr->GetSrc1()->AsSymOpnd()->m_sym->AsPropertySym() : accessorInstr->GetDst()->AsSymOpnd()->m_sym->AsPropertySym();
        if (JITManager::GetJITManager()->IsOOPJITEnabled())
        {
            Output::Print(_u("INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldId: %d\n"), isGetter ? _u("Getter") : _u("Setter"),
                funcBody->GetDisplayName(), inlineeData->GetDebugNumberSet(debugStringBuffer), funcCaller->GetDisplayName(), accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetDebugNumberSet(debugStringBuffer2),
                propertySym->m_propertyId);
        }
        else
        {
            Output::Print(_u("INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldName: %s\n"), isGetter ? _u("Getter") : _u("Setter"),
                funcBody->GetDisplayName(), inlineeData->GetDebugNumberSet(debugStringBuffer), funcCaller->GetDisplayName(), accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetDebugNumberSet(debugStringBuffer2),
                propertySym->GetFunc()->GetInProcThreadContext()->GetPropertyRecord(propertySym->m_propertyId)->GetBuffer());
        }
        Output::Flush();
    }
#endif
    IR::Opnd * methodOpnd = isGetter ? accessorInstr->GetSrc1() : accessorInstr->GetDst();
    Assert(methodOpnd->IsSymOpnd() && methodOpnd->AsSymOpnd()->IsPropertySymOpnd());

    inlineBailoutChecksBeforeInstr = SimulateCallForGetterSetter(accessorInstr, accessorInstr, methodOpnd->AsPropertySymOpnd(), isGetter);

    bool safeThis = false;
    TryOptimizeCallInstrWithFixedMethod(accessorInstr, inlineeData, false, false, false, true, safeThis);

    return InlineFunctionCommon(accessorInstr, false, nullptr, inlineeData, inlinee, instrNext, returnValueOpnd, inlineBailoutChecksBeforeInstr, symCallerThis, recursiveInlineDepth, safeThis);
}